

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masked_variance_intrin_ssse3.c
# Opt level: O1

void bilinear_filter(uint8_t *src,int src_stride,int xoffset,int yoffset,uint8_t *dst,int w,int h)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  undefined8 uVar3;
  uint8_t *puVar4;
  int iVar5;
  long lVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  uint8_t uVar9;
  uint8_t uVar10;
  uint8_t uVar11;
  uint8_t uVar12;
  uint8_t uVar13;
  uint8_t uVar14;
  uint8_t uVar15;
  uint8_t uVar16;
  uint8_t uVar17;
  uint8_t uVar18;
  uint8_t uVar19;
  uint8_t uVar20;
  uint8_t uVar21;
  uint8_t uVar22;
  uint8_t uVar23;
  uint8_t uVar24;
  short sVar25;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  short sVar34;
  short sVar35;
  short sVar54;
  short sVar55;
  short sVar56;
  short sVar57;
  short sVar58;
  short sVar59;
  undefined1 auVar36 [16];
  undefined1 auVar45 [16];
  undefined1 auVar53 [16];
  short sVar60;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar46 [16];
  undefined1 auVar39 [16];
  undefined1 auVar47 [16];
  undefined1 auVar40 [16];
  undefined1 auVar48 [16];
  undefined1 auVar41 [16];
  undefined1 auVar49 [16];
  undefined1 auVar42 [16];
  undefined1 auVar50 [16];
  undefined1 auVar43 [16];
  undefined1 auVar51 [16];
  undefined1 auVar44 [16];
  undefined1 auVar52 [16];
  
  if (xoffset == 0) {
    if (-1 < h) {
      puVar4 = dst;
      iVar5 = 0;
      do {
        if (0 < w) {
          lVar6 = 0;
          do {
            uVar3 = *(undefined8 *)(src + lVar6 + 8);
            *(undefined8 *)(puVar4 + lVar6) = *(undefined8 *)(src + lVar6);
            *(undefined8 *)(puVar4 + lVar6 + 8) = uVar3;
            lVar6 = lVar6 + 0x10;
          } while (lVar6 < w);
        }
        src = src + src_stride;
        puVar4 = puVar4 + (uint)w;
        bVar7 = iVar5 != h;
        iVar5 = iVar5 + 1;
      } while (bVar7);
    }
  }
  else if (xoffset == 4) {
    if (-1 < h) {
      puVar4 = dst;
      iVar5 = 0;
      do {
        if (0 < w) {
          lVar6 = 0;
          do {
            puVar1 = src + lVar6;
            uVar9 = pavgb(puVar1[1],*puVar1);
            uVar10 = pavgb(puVar1[2],puVar1[1]);
            uVar11 = pavgb(puVar1[3],puVar1[2]);
            uVar12 = pavgb(puVar1[4],puVar1[3]);
            uVar13 = pavgb(puVar1[5],puVar1[4]);
            uVar14 = pavgb(puVar1[6],puVar1[5]);
            uVar15 = pavgb(puVar1[7],puVar1[6]);
            uVar16 = pavgb(puVar1[8],puVar1[7]);
            uVar17 = pavgb(puVar1[9],puVar1[8]);
            uVar18 = pavgb(puVar1[10],puVar1[9]);
            uVar19 = pavgb(puVar1[0xb],puVar1[10]);
            uVar20 = pavgb(puVar1[0xc],puVar1[0xb]);
            uVar21 = pavgb(puVar1[0xd],puVar1[0xc]);
            uVar22 = pavgb(puVar1[0xe],puVar1[0xd]);
            uVar23 = pavgb(puVar1[0xf],puVar1[0xe]);
            uVar24 = pavgb(src[lVar6 + 0x10],puVar1[0xf]);
            puVar1 = puVar4 + lVar6;
            *puVar1 = uVar9;
            puVar1[1] = uVar10;
            puVar1[2] = uVar11;
            puVar1[3] = uVar12;
            puVar1[4] = uVar13;
            puVar1[5] = uVar14;
            puVar1[6] = uVar15;
            puVar1[7] = uVar16;
            puVar1[8] = uVar17;
            puVar1[9] = uVar18;
            puVar1[10] = uVar19;
            puVar1[0xb] = uVar20;
            puVar1[0xc] = uVar21;
            puVar1[0xd] = uVar22;
            puVar1[0xe] = uVar23;
            puVar1[0xf] = uVar24;
            lVar6 = lVar6 + 0x10;
          } while (lVar6 < w);
        }
        src = src + src_stride;
        puVar4 = puVar4 + (uint)w;
        bVar7 = iVar5 != h;
        iVar5 = iVar5 + 1;
      } while (bVar7);
    }
  }
  else if (-1 < h) {
    auVar8 = pshuflw(ZEXT216((ushort)bilinear_filters_2t[xoffset]),
                     ZEXT216((ushort)bilinear_filters_2t[xoffset]),0);
    auVar8._4_4_ = auVar8._0_4_;
    auVar8._8_4_ = auVar8._0_4_;
    auVar8._12_4_ = auVar8._0_4_;
    puVar4 = dst;
    iVar5 = 0;
    do {
      if (0 < w) {
        lVar6 = 0;
        do {
          auVar26 = *(undefined1 (*) [16])(src + lVar6);
          auVar44._0_14_ = auVar26._0_14_;
          auVar44[0xe] = auVar26[7];
          auVar44[0xf] = auVar26[8];
          auVar43._14_2_ = auVar44._14_2_;
          auVar43._0_13_ = auVar26._0_13_;
          auVar43[0xd] = auVar26[7];
          auVar42._13_3_ = auVar43._13_3_;
          auVar42._0_12_ = auVar26._0_12_;
          auVar42[0xc] = auVar26[6];
          auVar41._12_4_ = auVar42._12_4_;
          auVar41._0_11_ = auVar26._0_11_;
          auVar41[0xb] = auVar26[6];
          auVar40._11_5_ = auVar41._11_5_;
          auVar40._0_10_ = auVar26._0_10_;
          auVar40[10] = auVar26[5];
          auVar39._10_6_ = auVar40._10_6_;
          auVar39._0_9_ = auVar26._0_9_;
          auVar39[9] = auVar26[5];
          auVar38._9_7_ = auVar39._9_7_;
          auVar38._0_8_ = auVar26._0_8_;
          auVar38[8] = auVar26[4];
          auVar37._8_8_ = auVar38._8_8_;
          auVar37[7] = auVar26[4];
          auVar37[6] = auVar26[3];
          auVar37[5] = auVar26[3];
          auVar37[4] = auVar26[2];
          auVar37[3] = auVar26[2];
          auVar36._0_2_ = auVar26._0_2_;
          auVar37[2] = auVar26[1];
          auVar37._0_2_ = auVar36._0_2_;
          auVar36._2_14_ = auVar37._2_14_;
          auVar53 = pmaddubsw(auVar36,auVar8);
          sVar35 = pavgw(auVar53._0_2_ >> 6,0);
          sVar54 = pavgw(auVar53._2_2_ >> 6,0);
          sVar55 = pavgw(auVar53._4_2_ >> 6,0);
          sVar56 = pavgw(auVar53._6_2_ >> 6,0);
          sVar57 = pavgw(auVar53._8_2_ >> 6,0);
          sVar58 = pavgw(auVar53._10_2_ >> 6,0);
          sVar59 = pavgw(auVar53._12_2_ >> 6,0);
          sVar60 = pavgw(auVar53._14_2_ >> 6,0);
          auVar53._0_2_ = auVar26._8_2_;
          auVar53[2] = auVar26[9];
          auVar53[3] = auVar26[10];
          auVar53[4] = auVar26[10];
          auVar53[5] = auVar26[0xb];
          auVar53[6] = auVar26[0xb];
          auVar53[7] = auVar26[0xc];
          auVar53[8] = auVar26[0xc];
          auVar53[9] = auVar26[0xd];
          auVar53[10] = auVar26[0xd];
          auVar53[0xb] = auVar26[0xe];
          auVar53[0xc] = auVar26[0xe];
          auVar53[0xd] = auVar26[0xf];
          auVar53[0xe] = auVar26[0xf];
          auVar53[0xf] = src[lVar6 + 0x10];
          auVar26 = pmaddubsw(auVar53,auVar8);
          sVar25 = pavgw(auVar26._0_2_ >> 6,0);
          sVar28 = pavgw(auVar26._2_2_ >> 6,0);
          sVar29 = pavgw(auVar26._4_2_ >> 6,0);
          sVar30 = pavgw(auVar26._6_2_ >> 6,0);
          sVar31 = pavgw(auVar26._8_2_ >> 6,0);
          sVar32 = pavgw(auVar26._10_2_ >> 6,0);
          sVar33 = pavgw(auVar26._12_2_ >> 6,0);
          sVar34 = pavgw(auVar26._14_2_ >> 6,0);
          puVar1 = puVar4 + lVar6;
          *puVar1 = (0 < sVar35) * (sVar35 < 0x100) * (char)sVar35 - (0xff < sVar35);
          puVar1[1] = (0 < sVar54) * (sVar54 < 0x100) * (char)sVar54 - (0xff < sVar54);
          puVar1[2] = (0 < sVar55) * (sVar55 < 0x100) * (char)sVar55 - (0xff < sVar55);
          puVar1[3] = (0 < sVar56) * (sVar56 < 0x100) * (char)sVar56 - (0xff < sVar56);
          puVar1[4] = (0 < sVar57) * (sVar57 < 0x100) * (char)sVar57 - (0xff < sVar57);
          puVar1[5] = (0 < sVar58) * (sVar58 < 0x100) * (char)sVar58 - (0xff < sVar58);
          puVar1[6] = (0 < sVar59) * (sVar59 < 0x100) * (char)sVar59 - (0xff < sVar59);
          puVar1[7] = (0 < sVar60) * (sVar60 < 0x100) * (char)sVar60 - (0xff < sVar60);
          puVar1[8] = (0 < sVar25) * (sVar25 < 0x100) * (char)sVar25 - (0xff < sVar25);
          puVar1[9] = (0 < sVar28) * (sVar28 < 0x100) * (char)sVar28 - (0xff < sVar28);
          puVar1[10] = (0 < sVar29) * (sVar29 < 0x100) * (char)sVar29 - (0xff < sVar29);
          puVar1[0xb] = (0 < sVar30) * (sVar30 < 0x100) * (char)sVar30 - (0xff < sVar30);
          puVar1[0xc] = (0 < sVar31) * (sVar31 < 0x100) * (char)sVar31 - (0xff < sVar31);
          puVar1[0xd] = (0 < sVar32) * (sVar32 < 0x100) * (char)sVar32 - (0xff < sVar32);
          puVar1[0xe] = (0 < sVar33) * (sVar33 < 0x100) * (char)sVar33 - (0xff < sVar33);
          puVar1[0xf] = (0 < sVar34) * (sVar34 < 0x100) * (char)sVar34 - (0xff < sVar34);
          lVar6 = lVar6 + 0x10;
        } while (lVar6 < w);
      }
      src = src + src_stride;
      puVar4 = puVar4 + (uint)w;
      bVar7 = iVar5 != h;
      iVar5 = iVar5 + 1;
    } while (bVar7);
  }
  if (yoffset != 0) {
    if (yoffset == 4) {
      if (0 < h) {
        puVar4 = dst + (uint)w;
        iVar5 = 0;
        do {
          if (0 < w) {
            lVar6 = 0;
            do {
              puVar1 = dst + lVar6;
              puVar2 = puVar4 + lVar6;
              uVar9 = pavgb(*puVar2,*puVar1);
              uVar10 = pavgb(puVar2[1],puVar1[1]);
              uVar11 = pavgb(puVar2[2],puVar1[2]);
              uVar12 = pavgb(puVar2[3],puVar1[3]);
              uVar13 = pavgb(puVar2[4],puVar1[4]);
              uVar14 = pavgb(puVar2[5],puVar1[5]);
              uVar15 = pavgb(puVar2[6],puVar1[6]);
              uVar16 = pavgb(puVar2[7],puVar1[7]);
              uVar17 = pavgb(puVar2[8],puVar1[8]);
              uVar18 = pavgb(puVar2[9],puVar1[9]);
              uVar19 = pavgb(puVar2[10],puVar1[10]);
              uVar20 = pavgb(puVar2[0xb],puVar1[0xb]);
              uVar21 = pavgb(puVar2[0xc],puVar1[0xc]);
              uVar22 = pavgb(puVar2[0xd],puVar1[0xd]);
              uVar23 = pavgb(puVar2[0xe],puVar1[0xe]);
              uVar24 = pavgb(puVar2[0xf],puVar1[0xf]);
              puVar1 = dst + lVar6;
              *puVar1 = uVar9;
              puVar1[1] = uVar10;
              puVar1[2] = uVar11;
              puVar1[3] = uVar12;
              puVar1[4] = uVar13;
              puVar1[5] = uVar14;
              puVar1[6] = uVar15;
              puVar1[7] = uVar16;
              puVar1[8] = uVar17;
              puVar1[9] = uVar18;
              puVar1[10] = uVar19;
              puVar1[0xb] = uVar20;
              puVar1[0xc] = uVar21;
              puVar1[0xd] = uVar22;
              puVar1[0xe] = uVar23;
              puVar1[0xf] = uVar24;
              lVar6 = lVar6 + 0x10;
            } while (lVar6 < w);
          }
          dst = dst + (uint)w;
          iVar5 = iVar5 + 1;
          puVar4 = puVar4 + (uint)w;
        } while (iVar5 != h);
      }
    }
    else if (0 < h) {
      auVar8 = pshuflw(ZEXT216((ushort)bilinear_filters_2t[yoffset]),
                       ZEXT216((ushort)bilinear_filters_2t[yoffset]),0);
      auVar26._0_4_ = auVar8._0_4_;
      auVar26._4_4_ = auVar26._0_4_;
      auVar26._8_4_ = auVar26._0_4_;
      auVar26._12_4_ = auVar26._0_4_;
      puVar4 = dst + (uint)w;
      iVar5 = 0;
      do {
        if (0 < w) {
          lVar6 = 0;
          do {
            auVar8 = *(undefined1 (*) [16])(dst + lVar6);
            puVar1 = puVar4 + lVar6;
            auVar52._0_14_ = auVar8._0_14_;
            auVar52[0xe] = auVar8[7];
            auVar52[0xf] = puVar1[7];
            auVar51._14_2_ = auVar52._14_2_;
            auVar51._0_13_ = auVar8._0_13_;
            auVar51[0xd] = puVar1[6];
            auVar50._13_3_ = auVar51._13_3_;
            auVar50._0_12_ = auVar8._0_12_;
            auVar50[0xc] = auVar8[6];
            auVar49._12_4_ = auVar50._12_4_;
            auVar49._0_11_ = auVar8._0_11_;
            auVar49[0xb] = puVar1[5];
            auVar48._11_5_ = auVar49._11_5_;
            auVar48._0_10_ = auVar8._0_10_;
            auVar48[10] = auVar8[5];
            auVar47._10_6_ = auVar48._10_6_;
            auVar47._0_9_ = auVar8._0_9_;
            auVar47[9] = puVar1[4];
            auVar46._9_7_ = auVar47._9_7_;
            auVar46._0_8_ = auVar8._0_8_;
            auVar46[8] = auVar8[4];
            auVar45._8_8_ = auVar46._8_8_;
            auVar45[7] = puVar1[3];
            auVar45[6] = auVar8[3];
            auVar45[5] = puVar1[2];
            auVar45[4] = auVar8[2];
            auVar45[3] = puVar1[1];
            auVar45[2] = auVar8[1];
            auVar45[0] = auVar8[0];
            auVar45[1] = *puVar1;
            auVar53 = pmaddubsw(auVar45,auVar26);
            sVar35 = pavgw(auVar53._0_2_ >> 6,0);
            sVar54 = pavgw(auVar53._2_2_ >> 6,0);
            sVar55 = pavgw(auVar53._4_2_ >> 6,0);
            sVar56 = pavgw(auVar53._6_2_ >> 6,0);
            sVar57 = pavgw(auVar53._8_2_ >> 6,0);
            sVar58 = pavgw(auVar53._10_2_ >> 6,0);
            sVar59 = pavgw(auVar53._12_2_ >> 6,0);
            sVar60 = pavgw(auVar53._14_2_ >> 6,0);
            auVar27[1] = puVar1[8];
            auVar27[0] = auVar8[8];
            auVar27[2] = auVar8[9];
            auVar27[3] = puVar1[9];
            auVar27[4] = auVar8[10];
            auVar27[5] = puVar1[10];
            auVar27[6] = auVar8[0xb];
            auVar27[7] = puVar1[0xb];
            auVar27[8] = auVar8[0xc];
            auVar27[9] = puVar1[0xc];
            auVar27[10] = auVar8[0xd];
            auVar27[0xb] = puVar1[0xd];
            auVar27[0xc] = auVar8[0xe];
            auVar27[0xd] = puVar1[0xe];
            auVar27[0xe] = auVar8[0xf];
            auVar27[0xf] = puVar1[0xf];
            auVar8 = pmaddubsw(auVar27,auVar26);
            sVar25 = pavgw(auVar8._0_2_ >> 6,0);
            sVar28 = pavgw(auVar8._2_2_ >> 6,0);
            sVar29 = pavgw(auVar8._4_2_ >> 6,0);
            sVar30 = pavgw(auVar8._6_2_ >> 6,0);
            sVar31 = pavgw(auVar8._8_2_ >> 6,0);
            sVar32 = pavgw(auVar8._10_2_ >> 6,0);
            sVar33 = pavgw(auVar8._12_2_ >> 6,0);
            sVar34 = pavgw(auVar8._14_2_ >> 6,0);
            puVar1 = dst + lVar6;
            *puVar1 = (0 < sVar35) * (sVar35 < 0x100) * (char)sVar35 - (0xff < sVar35);
            puVar1[1] = (0 < sVar54) * (sVar54 < 0x100) * (char)sVar54 - (0xff < sVar54);
            puVar1[2] = (0 < sVar55) * (sVar55 < 0x100) * (char)sVar55 - (0xff < sVar55);
            puVar1[3] = (0 < sVar56) * (sVar56 < 0x100) * (char)sVar56 - (0xff < sVar56);
            puVar1[4] = (0 < sVar57) * (sVar57 < 0x100) * (char)sVar57 - (0xff < sVar57);
            puVar1[5] = (0 < sVar58) * (sVar58 < 0x100) * (char)sVar58 - (0xff < sVar58);
            puVar1[6] = (0 < sVar59) * (sVar59 < 0x100) * (char)sVar59 - (0xff < sVar59);
            puVar1[7] = (0 < sVar60) * (sVar60 < 0x100) * (char)sVar60 - (0xff < sVar60);
            puVar1[8] = (0 < sVar25) * (sVar25 < 0x100) * (char)sVar25 - (0xff < sVar25);
            puVar1[9] = (0 < sVar28) * (sVar28 < 0x100) * (char)sVar28 - (0xff < sVar28);
            puVar1[10] = (0 < sVar29) * (sVar29 < 0x100) * (char)sVar29 - (0xff < sVar29);
            puVar1[0xb] = (0 < sVar30) * (sVar30 < 0x100) * (char)sVar30 - (0xff < sVar30);
            puVar1[0xc] = (0 < sVar31) * (sVar31 < 0x100) * (char)sVar31 - (0xff < sVar31);
            puVar1[0xd] = (0 < sVar32) * (sVar32 < 0x100) * (char)sVar32 - (0xff < sVar32);
            puVar1[0xe] = (0 < sVar33) * (sVar33 < 0x100) * (char)sVar33 - (0xff < sVar33);
            puVar1[0xf] = (0 < sVar34) * (sVar34 < 0x100) * (char)sVar34 - (0xff < sVar34);
            lVar6 = lVar6 + 0x10;
          } while (lVar6 < w);
        }
        dst = dst + (uint)w;
        iVar5 = iVar5 + 1;
        puVar4 = puVar4 + (uint)w;
      } while (iVar5 != h);
    }
  }
  return;
}

Assistant:

static void bilinear_filter(const uint8_t *src, int src_stride, int xoffset,
                            int yoffset, uint8_t *dst, int w, int h) {
  int i, j;
  // Horizontal filter
  if (xoffset == 0) {
    uint8_t *b = dst;
    for (i = 0; i < h + 1; ++i) {
      for (j = 0; j < w; j += 16) {
        __m128i x = _mm_loadu_si128((__m128i *)&src[j]);
        _mm_storeu_si128((__m128i *)&b[j], x);
      }
      src += src_stride;
      b += w;
    }
  } else if (xoffset == 4) {
    uint8_t *b = dst;
    for (i = 0; i < h + 1; ++i) {
      for (j = 0; j < w; j += 16) {
        __m128i x = _mm_loadu_si128((__m128i *)&src[j]);
        __m128i y = _mm_loadu_si128((__m128i *)&src[j + 16]);
        __m128i z = _mm_alignr_epi8(y, x, 1);
        _mm_storeu_si128((__m128i *)&b[j], _mm_avg_epu8(x, z));
      }
      src += src_stride;
      b += w;
    }
  } else {
    uint8_t *b = dst;
    const uint8_t *hfilter = bilinear_filters_2t[xoffset];
    const __m128i hfilter_vec = _mm_set1_epi16(hfilter[0] | (hfilter[1] << 8));
    for (i = 0; i < h + 1; ++i) {
      for (j = 0; j < w; j += 16) {
        const __m128i x = _mm_loadu_si128((__m128i *)&src[j]);
        const __m128i y = _mm_loadu_si128((__m128i *)&src[j + 16]);
        const __m128i z = _mm_alignr_epi8(y, x, 1);
        const __m128i res = filter_block(x, z, hfilter_vec);
        _mm_storeu_si128((__m128i *)&b[j], res);
      }

      src += src_stride;
      b += w;
    }
  }

  // Vertical filter
  if (yoffset == 0) {
    // The data is already in 'dst', so no need to filter
  } else if (yoffset == 4) {
    for (i = 0; i < h; ++i) {
      for (j = 0; j < w; j += 16) {
        __m128i x = _mm_loadu_si128((__m128i *)&dst[j]);
        __m128i y = _mm_loadu_si128((__m128i *)&dst[j + w]);
        _mm_storeu_si128((__m128i *)&dst[j], _mm_avg_epu8(x, y));
      }
      dst += w;
    }
  } else {
    const uint8_t *vfilter = bilinear_filters_2t[yoffset];
    const __m128i vfilter_vec = _mm_set1_epi16(vfilter[0] | (vfilter[1] << 8));
    for (i = 0; i < h; ++i) {
      for (j = 0; j < w; j += 16) {
        const __m128i x = _mm_loadu_si128((__m128i *)&dst[j]);
        const __m128i y = _mm_loadu_si128((__m128i *)&dst[j + w]);
        const __m128i res = filter_block(x, y, vfilter_vec);
        _mm_storeu_si128((__m128i *)&dst[j], res);
      }

      dst += w;
    }
  }
}